

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwGetWindowFrameSize(GLFWwindow *handle,int *left,int *top,int *right,int *bottom)

{
  Atom AVar1;
  int iVar2;
  GLFWbool GVar3;
  _GLFWwindow *window;
  int *piStack_1e8;
  int *piStack_1e0;
  undefined8 uStack_1d8;
  int *piStack_1d0;
  int *piStack_1c8;
  double dStack_1c0;
  undefined1 auStack_1b4 [4];
  undefined4 auStack_1b0 [8];
  undefined8 uStack_190;
  Atom AStack_188;
  undefined4 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  int iStack_154;
  long alStack_f0 [24];
  
  if (left != (int *)0x0) {
    *left = 0;
  }
  if (top != (int *)0x0) {
    *top = 0;
  }
  if (right != (int *)0x0) {
    *right = 0;
  }
  if (bottom != (int *)0x0) {
    *bottom = 0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  piStack_1e8 = (int *)0x0;
  if (*(long *)(handle + 0x48) != 0) {
    return;
  }
  if (*(int *)(handle + 0xc) == 0) {
    return;
  }
  if (_glfw.x11.NET_FRAME_EXTENTS == 0) {
    return;
  }
  piStack_1d0 = top;
  piStack_1c8 = right;
  XGetWindowAttributes(_glfw.x11.display,*(undefined8 *)(handle + 0x350),auStack_1b0);
  AVar1 = _glfw.x11.NET_REQUEST_FRAME_EXTENTS;
  if (_glfw.x11.NET_REQUEST_FRAME_EXTENTS != 0 && iStack_154 != 2) {
    dStack_1c0 = 0.5;
    uStack_1d8 = *(undefined8 *)(handle + 0x350);
    piStack_1e0 = bottom;
    memset(auStack_1b0,0,0xc0);
    auStack_1b0[0] = 0x21;
    uStack_190 = uStack_1d8;
    uStack_180 = 0x20;
    AStack_188 = AVar1;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,auStack_1b0);
    while (iVar2 = XCheckIfEvent(_glfw.x11.display,alStack_f0,isFrameExtentsEvent,handle),
          bottom = piStack_1e0, iVar2 == 0) {
      GVar3 = waitForEvent(&dStack_1c0);
      if (GVar3 == 0) {
        _glfwInputError(0x10008,
                        "X11: The window manager has a broken _NET_REQUEST_FRAME_EXTENTS implementation; please report this issue"
                       );
        return;
      }
    }
  }
  XGetWindowProperty(_glfw.x11.display,*(undefined8 *)(handle + 0x350),_glfw.x11.NET_FRAME_EXTENTS,0
                     ,0x7fffffffffffffff,0,6,auStack_1b0,auStack_1b4,alStack_f0,&dStack_1c0,
                     &piStack_1e8);
  if (alStack_f0[0] == 4) {
    if (left != (int *)0x0) {
      *left = *piStack_1e8;
    }
    if (piStack_1d0 != (int *)0x0) {
      *piStack_1d0 = piStack_1e8[4];
    }
    if (piStack_1c8 != (int *)0x0) {
      *piStack_1c8 = piStack_1e8[2];
    }
    if (bottom != (int *)0x0) {
      *bottom = piStack_1e8[6];
      goto LAB_002275ed;
    }
  }
  if (piStack_1e8 == (int *)0x0) {
    return;
  }
LAB_002275ed:
  XFree();
  return;
}

Assistant:

GLFWAPI void glfwGetWindowFrameSize(GLFWwindow* handle,
                                    int* left, int* top,
                                    int* right, int* bottom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (left)
        *left = 0;
    if (top)
        *top = 0;
    if (right)
        *right = 0;
    if (bottom)
        *bottom = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowFrameSize(window, left, top, right, bottom);
}